

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tspm.cpp
# Opt level: O3

void __thiscall pg::TSPMSolver::run(TSPMSolver *this)

{
  ulong __n;
  uint64_t *puVar1;
  long lVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  int *__s;
  int *__s_00;
  int *__s_01;
  int *piVar6;
  int *piVar7;
  ostream *poVar8;
  Game *pGVar9;
  Error *this_00;
  ulong uVar10;
  int iVar11;
  int from;
  uint uVar12;
  char *pcVar13;
  ulong uVar14;
  int *piVar15;
  int from_1;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  
  pGVar9 = (this->super_Solver).game;
  uVar17 = pGVar9->n_vertices;
  piVar15 = pGVar9->_priority;
  uVar12 = *(uint *)((long)piVar15 + ((long)((uVar17 << 0x20) + -0x100000000) >> 0x1e));
  iVar11 = 2;
  if (0 < (int)uVar12) {
    iVar11 = uVar12 + 1;
  }
  lVar18 = (long)iVar11;
  uVar16 = uVar17 * lVar18;
  this->k = lVar18;
  __s = (int *)operator_new__(-(ulong)(uVar16 >> 0x3e != 0) | uVar16 * 4);
  this->pms = __s;
  __n = uVar17 * 4;
  uVar14 = -(ulong)(uVar17 >> 0x3e != 0) | __n;
  __s_00 = (int *)operator_new__(uVar14);
  this->strategy = __s_00;
  uVar10 = 0xffffffffffffffff;
  if (-1 < iVar11) {
    uVar10 = lVar18 * 4;
  }
  __s_01 = (int *)operator_new__(uVar10);
  this->counts = __s_01;
  piVar6 = (int *)operator_new__(uVar10);
  this->tmp = piVar6;
  piVar6 = (int *)operator_new__(uVar10);
  this->best = piVar6;
  piVar6 = (int *)operator_new__(uVar14);
  this->dirty = piVar6;
  piVar7 = (int *)operator_new__(uVar14);
  this->unstable = piVar7;
  if (0 < (long)uVar16) {
    memset(__s,0,uVar16 * 4);
  }
  if (0 < (long)uVar17) {
    memset(__s_00,0xff,__n);
  }
  if (0 < iVar11) {
    uVar10 = 1;
    if (1 < (int)uVar12) {
      uVar10 = (ulong)uVar12;
    }
    memset(__s_01,0,uVar10 * 4 + 4);
  }
  if (0 < (long)uVar17) {
    uVar10 = 0;
    puVar1 = ((this->super_Solver).disabled)->_bits;
    do {
      if ((puVar1[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) == 0) {
        __s_01[piVar15[uVar10]] = __s_01[piVar15[uVar10]] + 1;
      }
      uVar10 = uVar10 + 1;
    } while (uVar17 != uVar10);
    if (0 < (long)uVar17) {
      memset(piVar6,0,__n);
    }
  }
  uVar12 = (int)uVar17 - 1;
  this->lift_attempt = 0;
  this->lift_count = 0;
  if (-1 < (int)uVar12) {
    uVar17 = (ulong)uVar12;
    do {
      if ((((this->super_Solver).disabled)->_bits[uVar17 >> 6] >> (uVar17 & 0x3f) & 1) == 0) {
        bVar4 = lift(this,(int)uVar17,-1);
        if (bVar4) {
          pGVar9 = (this->super_Solver).game;
          piVar15 = pGVar9->_inedges;
          lVar18 = (long)pGVar9->_firstins[uVar17];
          iVar11 = piVar15[lVar18];
          if (iVar11 != -1) {
            piVar15 = piVar15 + lVar18 + 1;
            do {
              if ((((this->super_Solver).disabled)->_bits[(ulong)(long)iVar11 >> 6] >>
                   ((long)iVar11 & 0x3fU) & 1) == 0) {
                bVar4 = lift(this,iVar11,(int)uVar17);
                if (bVar4) {
                  todo_push(this,iVar11);
                }
              }
              iVar11 = *piVar15;
              piVar15 = piVar15 + 1;
            } while (iVar11 != -1);
          }
        }
      }
      bVar4 = 0 < (long)uVar17;
      uVar17 = uVar17 - 1;
    } while (bVar4);
  }
  poVar8 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"main loop now",0xd);
  std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if ((this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_cur !=
      (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_start._M_cur) {
    lVar18 = 0;
    do {
      iVar5 = todo_pop(this);
      pGVar9 = (this->super_Solver).game;
      iVar11 = pGVar9->_inedges[pGVar9->_firstins[iVar5]];
      if (iVar11 != -1) {
        piVar15 = pGVar9->_inedges + (long)pGVar9->_firstins[iVar5] + 1;
        do {
          if ((((this->super_Solver).disabled)->_bits[(ulong)(long)iVar11 >> 6] >>
               ((long)iVar11 & 0x3fU) & 1) == 0) {
            bVar4 = lift(this,iVar11,iVar5);
            if (bVar4) {
              todo_push(this,iVar11);
            }
          }
          iVar11 = *piVar15;
          piVar15 = piVar15 + 1;
        } while (iVar11 != -1);
        pGVar9 = (this->super_Solver).game;
      }
      lVar2 = this->lift_count;
      if (lVar18 + pGVar9->n_vertices * 10 < lVar2) {
        update(this,0);
        update(this,1);
        lVar18 = lVar2;
      }
    } while ((this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur !=
             (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur);
  }
  pGVar9 = (this->super_Solver).game;
  lVar18 = pGVar9->n_vertices;
  if (1 < (this->super_Solver).trace) {
    if (lVar18 < 1) goto LAB_0016d8e5;
    uVar17 = 0;
    do {
      if ((((this->super_Solver).disabled)->_bits[uVar17 >> 6] >> (uVar17 & 0x3f) & 1) == 0) {
        poVar8 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"\x1b[35m**\x1b[m \x1b[1mnode ",0x14);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)uVar17);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"/",1);
        poVar8 = (ostream *)
                 std::ostream::operator<<(poVar8,((this->super_Solver).game)->_priority[uVar17]);
        pcVar13 = " (odd)";
        bVar4 = ((((this->super_Solver).game)->_owner)._bits[uVar17 >> 6] & 1L << (uVar17 & 0x3f))
                == 0;
        if (bVar4) {
          pcVar13 = " (even)";
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar13,(ulong)bVar4 | 6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[m is",6);
        pm_stream(this,(this->super_Solver).logger,this->pms + this->k * uVar17);
        poVar8 = (this->super_Solver).logger;
        cVar3 = (char)poVar8;
        std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + cVar3);
        std::ostream::put(cVar3);
        std::ostream::flush();
        pGVar9 = (this->super_Solver).game;
        lVar18 = pGVar9->n_vertices;
      }
      uVar17 = uVar17 + 1;
    } while ((long)uVar17 < lVar18);
  }
  if (0 < lVar18) {
    uVar17 = 0;
    do {
      if ((((this->super_Solver).disabled)->_bits[uVar17 >> 6] >> (uVar17 & 0x3f) & 1) == 0) {
        lVar18 = this->k * uVar17;
        iVar11 = this->pms[lVar18];
        if ((iVar11 == -1) != (this->pms[lVar18 + 1] != -1)) {
          this_00 = (Error *)__cxa_allocate_exception(0x40);
          Error::Error(this_00,"logic error",
                       "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/tspm.cpp"
                       ,0x1a1);
          __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
        }
        iVar5 = -1;
        if ((((pGVar9->_owner)._bits[uVar17 >> 6] & 1L << (uVar17 & 0x3f)) != 0) == (iVar11 != -1))
        {
          iVar5 = this->strategy[uVar17];
        }
        Oink::solve((this->super_Solver).oink,(int)uVar17,(uint)(iVar11 != -1),iVar5);
        pGVar9 = (this->super_Solver).game;
        lVar18 = pGVar9->n_vertices;
      }
      uVar17 = uVar17 + 1;
    } while ((long)uVar17 < lVar18);
  }
LAB_0016d8e5:
  if (this->pms != (int *)0x0) {
    operator_delete__(this->pms);
  }
  if (this->strategy != (int *)0x0) {
    operator_delete__(this->strategy);
  }
  if (this->counts != (int *)0x0) {
    operator_delete__(this->counts);
  }
  if (this->tmp != (int *)0x0) {
    operator_delete__(this->tmp);
  }
  if (this->best != (int *)0x0) {
    operator_delete__(this->best);
  }
  if (this->dirty != (int *)0x0) {
    operator_delete__(this->dirty);
  }
  if (this->unstable != (int *)0x0) {
    operator_delete__(this->unstable);
  }
  poVar8 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"solved with ",0xc);
  poVar8 = std::ostream::_M_insert<long>((long)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," lifts, ",8);
  poVar8 = std::ostream::_M_insert<long>((long)poVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," lift attempts.",0xf);
  std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  return;
}

Assistant:

void
TSPMSolver::run()
{
    // determine k = highest priority + 1
    k = priority(nodecount()-1)+1;
    if (k < 2) k = 2;

    // now create the data structure, for each node
    pms = new int[(size_t)k*nodecount()];
    strategy = new int[nodecount()];
    counts = new int[k];
    tmp = new int[k];
    best = new int[k];
    dirty = new int[nodecount()];
    unstable = new int[nodecount()];

    // initialize all measures to 0
    for (int i=0; i<k*nodecount(); i++) pms[i] = 0;

    // initialize strategy to -1
    for (int i=0; i<nodecount(); i++) strategy[i] = -1;

    // initialize counts for each priority
    for (int i=0; i<k; i++) counts[i] = 0;
    for (int i=0; i<nodecount(); i++) if (disabled[i] == 0) counts[priority(i)]++;

    // initialize all nodes as not dirty
    for (int n=0; n<nodecount(); n++) dirty[n] = 0;

    // set number of lifts and lift attempts to 0
    lift_count = lift_attempt = 0;

    /**
     * Strategy that updates predecessors then marks updated predecessors for processing.
     * Uses a queue/stack to store the dirty vertices.
     */

    /**
     * Initialization loop.
     */

    for (int n=nodecount()-1; n>=0; n--) {
        if (!disabled[n] and lift(n, -1)) {
            for (auto curedge = ins(n); *curedge != -1; curedge++) {
                int from = *curedge;
                if (!disabled[from] and lift(from, n)) todo_push(from);
            }
        }
    }
    
    /**
     * The main loop.
     */

    logger << "main loop now" << std::endl;
    int64_t last_update = 0;

    while (!todo.empty()) {
        int n = todo_pop();
        for (auto curedge = ins(n); *curedge != -1; curedge++) {
            int from = *curedge;
            if (!disabled[from] and lift(from, n)) todo_push(from);
        }
        if (last_update + 10*nodecount() < lift_count) {
            last_update = lift_count;
            update(0);
            update(1);
        }
    }

#ifndef NDEBUG
    if (trace >= 2) {
        for (int n=0; n<nodecount(); n++) {
            if (disabled[n]) continue;
            logger << "\033[35m**\033[m \033[1mnode " << n << "/" << priority(n) << (owner(n)?" (odd)":" (even)") << "\033[m is";
            pm_stream(logger, pms + k*n);
            logger << std::endl;
        }
    }
#endif
    
    // Now set dominions and derive strategy for even.
    for (int n=0; n<nodecount(); n++) {
        if (disabled[n]) continue;
        int *pm = pms + k*n;
        if ((pm[0] == -1) == (pm[1] == -1)) LOGIC_ERROR;
        const int winner = pm[0] == -1 ? 0 : 1;
        Solver::solve(n, winner, owner(n) == winner ? strategy[n] : -1);
    }

    delete[] pms;
    delete[] strategy;
    delete[] counts;
    delete[] tmp;
    delete[] best;
    delete[] dirty;
    delete[] unstable;

    logger << "solved with " << lift_count << " lifts, " << lift_attempt << " lift attempts." << std::endl;
}